

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

shared_ptr<GenApi_3_4::CChunkAdapter> __thiscall
rcg::getChunkAdapter(rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,string *tltype)

{
  bool bVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<GenApi_3_4::CChunkAdapter> sVar4;
  CChunkAdapterGeneric *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  bVar1 = setBoolean(nodemap,"ChunkModeActive",true,false);
  _Var3._M_pi = extraout_RDX;
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)tltype);
    if (iVar2 == 0) {
      local_28 = (CChunkAdapterGeneric *)operator_new(0x18);
      GenApi_3_4::CChunkAdapterGEV::CChunkAdapterGEV
                ((CChunkAdapterGEV *)local_28,
                 (((nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<GenApi_3_4::CChunkAdapterGEV*>
                (&_Stack_20,(CChunkAdapterGEV *)local_28);
      _Var3._M_pi = extraout_RDX_01;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)tltype);
      if (iVar2 == 0) {
        local_28 = (CChunkAdapterGeneric *)operator_new(0x18);
        GenApi_3_4::CChunkAdapterU3V::CChunkAdapterU3V
                  ((CChunkAdapterU3V *)local_28,
                   (((nodemap->
                     super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<GenApi_3_4::CChunkAdapterU3V*>(&_Stack_20,(CChunkAdapterU3V *)local_28);
        _Var3._M_pi = extraout_RDX_02;
      }
      else {
        local_28 = (CChunkAdapterGeneric *)operator_new(0x18);
        GenApi_3_4::CChunkAdapterGeneric::CChunkAdapterGeneric
                  (local_28,(((nodemap->
                              super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                            _Ptr,-1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<GenApi_3_4::CChunkAdapterGeneric*>(&_Stack_20,local_28);
        _Var3._M_pi = extraout_RDX_00;
      }
    }
    *(CChunkAdapterGeneric **)this = local_28;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Stack_20._M_pi;
  }
  sVar4.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar4.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<GenApi_3_4::CChunkAdapter>)
         sVar4.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CChunkAdapter> getChunkAdapter(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap,
                                                       const std::string &tltype)
{
  std::shared_ptr<GenApi::CChunkAdapter> chunkadapter;

  if (setBoolean(nodemap, "ChunkModeActive", true))
  {
    if (tltype == "GEV")
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGEV(nodemap->_Ptr));
    }
    else if (tltype == "U3V")
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterU3V(nodemap->_Ptr));
    }
    else
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGeneric(nodemap->_Ptr));
    }
  }

  return chunkadapter;
}